

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_outpoint.cpp
# Opt level: O0

void __thiscall OutPoint_NotEquals_Test::TestBody(OutPoint_NotEquals_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *in_R9;
  string local_258;
  AssertHelper local_238;
  Message local_230;
  bool local_221;
  undefined1 local_220 [8];
  AssertionResult gtest_ar__2;
  AssertHelper local_1f0;
  Message local_1e8;
  bool local_1d9;
  undefined1 local_1d8 [8];
  AssertionResult gtest_ar__1;
  AssertHelper local_1a8;
  Message local_1a0;
  bool local_191;
  undefined1 local_190 [8];
  AssertionResult gtest_ar_;
  OutPoint outpoint4;
  OutPoint outpoint3;
  OutPoint outpoint2;
  OutPoint outpoint1;
  Txid txid2;
  string local_b8;
  undefined1 local_98 [8];
  ByteData256 byte_data2;
  Txid txid;
  allocator local_49;
  string local_48;
  undefined1 local_28 [8];
  ByteData256 byte_data;
  OutPoint_NotEquals_Test *this_local;
  
  byte_data.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_48,"3412907856341290785634129078563412907856341290785634129078563412",
             &local_49);
  cfd::core::ByteData256::ByteData256((ByteData256 *)local_28,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  cfd::core::Txid::Txid
            ((Txid *)&byte_data2.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,(ByteData256 *)local_28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_b8,"9812907856341290785634129078563412907856341290785634129078563412",
             (allocator *)
             ((long)&txid2.data_.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  cfd::core::ByteData256::ByteData256((ByteData256 *)local_98,&local_b8);
  std::__cxx11::string::~string((string *)&local_b8);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&txid2.data_.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  cfd::core::Txid::Txid((Txid *)&outpoint1.vout_,(ByteData256 *)local_98);
  cfd::core::OutPoint::OutPoint
            ((OutPoint *)&outpoint2.vout_,
             (Txid *)&byte_data2.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,1);
  cfd::core::OutPoint::OutPoint
            ((OutPoint *)&outpoint3.vout_,
             (Txid *)&byte_data2.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,1);
  cfd::core::OutPoint::OutPoint
            ((OutPoint *)&outpoint4.vout_,
             (Txid *)&byte_data2.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,2);
  cfd::core::OutPoint::OutPoint((OutPoint *)&gtest_ar_.message_,(Txid *)&outpoint1.vout_,1);
  bVar1 = cfd::core::OutPoint::operator!=((OutPoint *)&outpoint2.vout_,(OutPoint *)&outpoint3.vout_)
  ;
  local_191 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_190,&local_191,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_190);
  if (!bVar1) {
    testing::Message::Message(&local_1a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__1.message_,(internal *)local_190,
               (AssertionResult *)"(outpoint1 != outpoint2)","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_outpoint.cpp"
               ,0x3e,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1a8,&local_1a0);
    testing::internal::AssertHelper::~AssertHelper(&local_1a8);
    std::__cxx11::string::~string((string *)&gtest_ar__1.message_);
    testing::Message::~Message(&local_1a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_190);
  local_1d9 = cfd::core::OutPoint::operator!=
                        ((OutPoint *)&outpoint2.vout_,(OutPoint *)&outpoint4.vout_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1d8,&local_1d9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1d8);
  if (!bVar1) {
    testing::Message::Message(&local_1e8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__2.message_,(internal *)local_1d8,
               (AssertionResult *)"(outpoint1 != outpoint3)","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_outpoint.cpp"
               ,0x3f,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1f0,&local_1e8);
    testing::internal::AssertHelper::~AssertHelper(&local_1f0);
    std::__cxx11::string::~string((string *)&gtest_ar__2.message_);
    testing::Message::~Message(&local_1e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1d8);
  local_221 = cfd::core::OutPoint::operator!=
                        ((OutPoint *)&outpoint2.vout_,(OutPoint *)&gtest_ar_.message_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_220,&local_221,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_220);
  if (!bVar1) {
    testing::Message::Message(&local_230);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_258,(internal *)local_220,(AssertionResult *)"(outpoint1 != outpoint4)",
               "false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_238,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_outpoint.cpp"
               ,0x40,pcVar2);
    testing::internal::AssertHelper::operator=(&local_238,&local_230);
    testing::internal::AssertHelper::~AssertHelper(&local_238);
    std::__cxx11::string::~string((string *)&local_258);
    testing::Message::~Message(&local_230);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_220);
  cfd::core::OutPoint::~OutPoint((OutPoint *)&gtest_ar_.message_);
  cfd::core::OutPoint::~OutPoint((OutPoint *)&outpoint4.vout_);
  cfd::core::OutPoint::~OutPoint((OutPoint *)&outpoint3.vout_);
  cfd::core::OutPoint::~OutPoint((OutPoint *)&outpoint2.vout_);
  cfd::core::Txid::~Txid((Txid *)&outpoint1.vout_);
  cfd::core::ByteData256::~ByteData256((ByteData256 *)local_98);
  cfd::core::Txid::~Txid
            ((Txid *)&byte_data2.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
  cfd::core::ByteData256::~ByteData256((ByteData256 *)local_28);
  return;
}

Assistant:

TEST(OutPoint, NotEquals) {
  ByteData256 byte_data = ByteData256(
      "3412907856341290785634129078563412907856341290785634129078563412");
  Txid txid = Txid(byte_data);
  ByteData256 byte_data2 = ByteData256(
      "9812907856341290785634129078563412907856341290785634129078563412");
  Txid txid2 = Txid(byte_data2);
  OutPoint outpoint1(txid, 1);
  OutPoint outpoint2(txid, 1);
  OutPoint outpoint3(txid, 2);
  OutPoint outpoint4(txid2, 1);

  EXPECT_FALSE((outpoint1 != outpoint2));
  EXPECT_TRUE((outpoint1 != outpoint3));
  EXPECT_TRUE((outpoint1 != outpoint4));
}